

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_description_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  unsigned_long __val;
  unsigned_long __val_00;
  string *this_00;
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ::std::__cxx11::string::string((string *)&local_a0,(string *)&app->description_);
  __val = app->require_option_min_;
  __val_00 = app->require_option_max_;
  if (app->required_ == true) {
    ::std::__cxx11::string::append((char *)&local_a0);
  }
  if (__val == 0 || __val_00 != __val) {
    if (__val_00 == 0) {
      if (__val == 0) goto LAB_0012822d;
      std::__cxx11::to_string(&local_100,__val);
      ::std::operator+(&local_e0," \n[At least ",&local_100);
      ::std::operator+(&local_c0,&local_e0," of the following options are required]");
      ::std::__cxx11::string::append((string *)&local_a0);
      goto LAB_0012820f;
    }
    if (__val == 0) {
      std::__cxx11::to_string(&local_100,__val_00);
      ::std::operator+(&local_e0," \n[At most ",&local_100);
      ::std::operator+(&local_c0,&local_e0," of the following options are allowed]");
      ::std::__cxx11::string::append((string *)&local_a0);
      goto LAB_0012820f;
    }
    std::__cxx11::to_string(&local_60,__val);
    ::std::operator+(&local_40," \n[Between ",&local_60);
    ::std::operator+(&local_100,&local_40," and ");
    std::__cxx11::to_string(&local_80,__val_00);
    ::std::operator+(&local_e0,&local_100,&local_80);
    ::std::operator+(&local_c0,&local_e0," of the follow options are required]");
    ::std::__cxx11::string::append((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_40);
    this_00 = &local_60;
  }
  else {
    if (__val == 1) {
      ::std::__cxx11::string::append((char *)&local_a0);
      goto LAB_0012822d;
    }
    std::__cxx11::to_string(&local_100,__val);
    ::std::operator+(&local_e0," \n[Exactly ",&local_100);
    ::std::operator+(&local_c0,&local_e0,"options from the following list are required]");
    ::std::__cxx11::string::append((string *)&local_a0);
LAB_0012820f:
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    this_00 = &local_100;
  }
  ::std::__cxx11::string::~string((string *)this_00);
LAB_0012822d:
  if (local_a0._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ::std::operator+(__return_storage_ptr__,&local_a0,"\n");
  }
  ::std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_description(const App *app) const {
    std::string desc = app->get_description();
    auto min_options = app->get_require_option_min();
    auto max_options = app->get_require_option_max();
    if(app->get_required()) {
        desc += " REQUIRED ";
    }
    if((max_options == min_options) && (min_options > 0)) {
        if(min_options == 1) {
            desc += " \n[Exactly 1 of the following options is required]";
        } else {
            desc += " \n[Exactly " + std::to_string(min_options) + "options from the following list are required]";
        }
    } else if(max_options > 0) {
        if(min_options > 0) {
            desc += " \n[Between " + std::to_string(min_options) + " and " + std::to_string(max_options) +
                    " of the follow options are required]";
        } else {
            desc += " \n[At most " + std::to_string(max_options) + " of the following options are allowed]";
        }
    } else if(min_options > 0) {
        desc += " \n[At least " + std::to_string(min_options) + " of the following options are required]";
    }
    return (!desc.empty()) ? desc + "\n" : std::string{};
}